

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_unit.cc
# Opt level: O1

bool __thiscall
pstack::Dwarf::Unit::sourceFromAddr
          (Unit *this,Addr addr,
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *info)

{
  int iVar1;
  LineInfo *pLVar2;
  long lVar3;
  long lVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  ContainsAddr CVar6;
  unique_ptr<pstack::Dwarf::LineInfo,_std::default_delete<pstack::Dwarf::LineInfo>_> *puVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  long lVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  bool bVar11;
  pointer pLVar12;
  undefined1 local_98 [8];
  DIE d;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  root((DIE *)local_98,this);
  CVar6 = DIE::containsAddress((DIE *)local_98,addr);
  if (CVar6 != NO) {
    puVar7 = getLines(this);
    pLVar2 = (puVar7->_M_t).
             super___uniq_ptr_impl<pstack::Dwarf::LineInfo,_std::default_delete<pstack::Dwarf::LineInfo>_>
             ._M_t.
             super__Tuple_impl<0UL,_pstack::Dwarf::LineInfo_*,_std::default_delete<pstack::Dwarf::LineInfo>_>
             .super__Head_base<0UL,_pstack::Dwarf::LineInfo_*,_false>._M_head_impl;
    if (pLVar2 != (LineInfo *)0x0) {
      for (pLVar12 = *(pointer *)
                      &(pLVar2->matrix).
                       super__Vector_base<pstack::Dwarf::LineState,_std::allocator<pstack::Dwarf::LineState>_>
                       ._M_impl;
          pLVar12 !=
          *(pointer *)
           ((long)&(pLVar2->matrix).
                   super__Vector_base<pstack::Dwarf::LineState,_std::allocator<pstack::Dwarf::LineState>_>
           + 8); pLVar12 = pLVar12 + 1) {
        if ((((pLVar12->field_0x18 & 4) == 0) && (pLVar12->addr <= addr)) &&
           (addr < pLVar12[1].addr)) {
          iVar1 = ((this->dwarf->elf).
                   super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  context->verbose;
          if (iVar1 == 0) {
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            lVar3 = *(long *)&pLVar12->file->name;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_50,lVar3,
                       *(size_type *)((long)&pLVar12->file->name + 8) + lVar3);
          }
          else {
            lVar3 = *(long *)&(pLVar2->directories).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl;
            lVar9 = (ulong)pLVar12->file->dirindex * 0x20;
            d.unit.super___shared_ptr<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = &local_60;
            lVar4 = *(long *)(lVar3 + lVar9);
            std::__cxx11::string::_M_construct<char*>
                      ((string *)
                       &d.unit.super___shared_ptr<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,lVar4,*(long *)(lVar3 + 8 + lVar9) + lVar4);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &d.unit.super___shared_ptr<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,"/");
            pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::_M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&d.unit.
                                     super___shared_ptr<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount,*(char **)&pLVar12->file->name,
                                 *(size_type *)((long)&pLVar12->file->name + 8));
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(pbVar8->_M_dataplus)._M_p;
            paVar10 = &pbVar8->field_2;
            if (paVar5 == paVar10) {
              local_50.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
              local_50.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
            }
            else {
              local_50.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
              local_50._M_dataplus._M_p = (pointer)paVar5;
            }
            local_50._M_string_length = pbVar8->_M_string_length;
            (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
            pbVar8->_M_string_length = 0;
            (pbVar8->field_2)._M_local_buf[0] = '\0';
          }
          std::
          vector<std::pair<std::__cxx11::string,int>,std::allocator<std::pair<std::__cxx11::string,int>>>
          ::emplace_back<std::__cxx11::string,unsigned_int&>
                    ((vector<std::pair<std::__cxx11::string,int>,std::allocator<std::pair<std::__cxx11::string,int>>>
                      *)info,&local_50,&pLVar12->line);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          if ((iVar1 != 0) &&
             (d.unit.super___shared_ptr<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi != &local_60)) {
            operator_delete(d.unit.
                            super___shared_ptr<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi,(long)local_60._vptr__Sp_counted_base + 1);
          }
          bVar11 = true;
          goto LAB_00144cb4;
        }
      }
    }
  }
  bVar11 = false;
LAB_00144cb4:
  DIE::~DIE((DIE *)local_98);
  return bVar11;
}

Assistant:

bool
Unit::sourceFromAddr(Elf::Addr addr, std::vector<std::pair<std::string, int>> &info) {
    DIE d = root();
    if (d.containsAddress(addr) == ContainsAddr::NO)
        return false;
    const auto &lines = getLines();
    if (lines != nullptr) {
        for (auto i = lines->matrix.begin(); i != lines->matrix.end(); ++i) {
            if (i->end_sequence)
                continue;
            auto next = i+1;
            if (i->addr <= addr && next->addr > addr) {
                const std::string &dirname = lines->directories[i->file->dirindex];
                info.emplace_back(dwarf->elf->context.verbose != 0 ? dirname + "/" + i->file->name : i->file->name, i->line);
                return true;
            }
        }
    }
    return false;
}